

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

void __thiscall Sym::Sym(Sym *this,string *type,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  Sym *pSVar3;
  string *str;
  double dVar4;
  string local_60;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Type)._M_dataplus._M_p = (pointer)&(this->Type).field_2;
  (this->Type)._M_string_length = 0;
  (this->Type).field_2._M_local_buf[0] = '\0';
  this->iValue = 0;
  this->dValue = 0.0;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->Type);
  bVar1 = std::operator==(type,"real");
  if (bVar1) {
    pSVar3 = (Sym *)&stack0xffffffffffffffc0;
    std::__cxx11::string::string((string *)pSVar3,(string *)value);
    str = (string *)&stack0xffffffffffffffc0;
    dVar4 = str2double(pSVar3,str);
    this->dValue = dVar4;
  }
  else {
    pSVar3 = (Sym *)&local_60;
    std::__cxx11::string::string((string *)pSVar3,(string *)value);
    str = &local_60;
    iVar2 = str2int(pSVar3,str);
    this->iValue = iVar2;
  }
  std::__cxx11::string::~string((string *)str);
  return;
}

Assistant:

Sym::Sym(std::string type, std::string name, std::string value) {
    Name = name;
    Type = type;
    if (type == "real") {
        dValue = str2double(value);
    } else {//int
        iValue = str2int(value);
    }
}